

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::DataParameter::Clear(DataParameter *this)

{
  bool bVar1;
  string *psVar2;
  LogMessage *pLVar3;
  LogFinisher local_ea;
  byte local_e9;
  LogMessage local_e8;
  LogFinisher local_ad [20];
  byte local_99;
  LogMessage local_98;
  DataParameter *local_60;
  DataParameter *this_local;
  InternalMetadataWithArena *local_50;
  InternalMetadataWithArena *local_48;
  undefined4 local_3c;
  HasBits<1UL> *local_38;
  undefined4 local_2c;
  HasBits<1UL> *local_28;
  undefined4 local_1c;
  HasBits<1UL> *local_18;
  InternalMetadataWithArena *local_10;
  
  local_18 = &this->_has_bits_;
  local_1c = 0;
  local_60 = this;
  if ((local_18->has_bits_[0] & 3) != 0) {
    bVar1 = has_source(this);
    if (bVar1) {
      psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(&this->source_,psVar2);
      local_99 = 0;
      if (bVar1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_98,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x5a8f);
        local_99 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_98,
                            "CHECK failed: !source_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(local_ad,pLVar3);
      }
      if ((local_99 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_98);
      }
      google::protobuf::internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_(&this->source_);
      std::__cxx11::string::clear();
    }
    bVar1 = has_mean_file(this);
    if (bVar1) {
      psVar2 = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      bVar1 = google::protobuf::internal::ArenaStringPtr::IsDefault(&this->mean_file_,psVar2);
      local_e9 = 0;
      if (bVar1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_e8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
                   ,0x5a93);
        local_e9 = 1;
        pLVar3 = google::protobuf::internal::LogMessage::operator<<
                           (&local_e8,
                            "CHECK failed: !mean_file_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()): "
                           );
        google::protobuf::internal::LogFinisher::operator=(&local_ea,pLVar3);
      }
      if ((local_e9 & 1) != 0) {
        google::protobuf::internal::LogMessage::~LogMessage(&local_e8);
      }
      google::protobuf::internal::ArenaStringPtr::UnsafeRawStringPointer_abi_cxx11_
                (&this->mean_file_);
      std::__cxx11::string::clear();
    }
  }
  local_28 = &this->_has_bits_;
  local_2c = 0;
  if ((local_28->has_bits_[0] & 0xfc) != 0) {
    memset(&this->batch_size_,0,0x14);
  }
  local_38 = &this->_has_bits_;
  local_3c = 0;
  if ((local_38->has_bits_[0] & 0x300) != 0) {
    this->scale_ = 1.0;
    this->prefetch_ = 4;
  }
  this_local = (DataParameter *)&this->_has_bits_;
  memset(this_local,0,4);
  local_50 = &this->_internal_metadata_;
  if (((uint)(local_50->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_48 = local_50;
    local_10 = local_50;
    google::protobuf::internal::InternalMetadataWithArena::DoClear(local_50);
  }
  return;
}

Assistant:

void DataParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.DataParameter)
  if (_has_bits_[0 / 32] & 3u) {
    if (has_source()) {
      GOOGLE_DCHECK(!source_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*source_.UnsafeRawStringPointer())->clear();
    }
    if (has_mean_file()) {
      GOOGLE_DCHECK(!mean_file_.IsDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited()));
      (*mean_file_.UnsafeRawStringPointer())->clear();
    }
  }
  if (_has_bits_[0 / 32] & 252u) {
    ::memset(&batch_size_, 0, reinterpret_cast<char*>(&backend_) -
      reinterpret_cast<char*>(&batch_size_) + sizeof(backend_));
  }
  if (_has_bits_[8 / 32] & 768u) {
    scale_ = 1;
    prefetch_ = 4u;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}